

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float ImGui::GetColumnWidth(int column_index)

{
  float fVar1;
  float fVar2;
  
  if (column_index < 0) {
    column_index = (GImGui->CurrentWindow->DC).ColumnsCurrent;
  }
  fVar1 = GetColumnOffset(column_index + 1);
  fVar2 = GetColumnOffset(column_index);
  return fVar1 - fVar2;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    float w = GetColumnOffset(column_index+1) - GetColumnOffset(column_index);
    return w;
}